

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  U32 offBase;
  ZSTD_compressedBlockState_t *CTable;
  uint *count;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  void *pvVar5;
  int iVar6;
  size_t err_code_1;
  ZSTD_sequenceLength ZVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint flags;
  size_t __n;
  size_t err_code_2;
  seqDef *psVar14;
  size_t sVar15;
  byte *pbVar16;
  ulong uVar17;
  BYTE *source;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  byte *pbVar21;
  undefined4 in_register_0000008c;
  symbolEncodingType_e sVar22;
  long lVar23;
  seqDef *seq;
  ulong sourceSize;
  seqStore_t *seqStorePtr;
  size_t err_code;
  undefined4 in_stack_fffffffffffffd7c;
  size_t local_260;
  byte *local_258;
  seqDef *local_250;
  void *local_220;
  BYTE *local_210;
  BYTE *local_208;
  BYTE *local_200;
  HUF_CElt local_1f0;
  U32 local_1e8;
  ZSTD_compressedBlockState_t *local_1e0;
  void *local_1d8;
  undefined8 local_1d0;
  FSE_CTable *local_1c8;
  FSE_CTable *local_1c0;
  ZSTD_fseCTables_t *local_1b8;
  seqDef *local_1b0;
  void *local_1a8;
  ulong local_1a0;
  ZSTD_CCtx *local_198;
  seqDef *local_190;
  BYTE *local_188;
  seqStore_t *local_180;
  seqDef *local_178;
  size_t local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1d0 = CONCAT44(in_register_0000008c,lastBlock);
  seqStorePtr = &zc->seqStore;
  local_258 = (byte *)ZSTD_buildBlockEntropyStats
                                (seqStorePtr,&((zc->blockState).prevCBlock)->entropy,
                                 &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                                 &entropyMetadata,zc->entropyWorkspace,0x22d8);
  if (local_258 < (byte *)0xffffffffffffff89) {
    local_1e0 = (zc->blockState).prevCBlock;
    CTable = (zc->blockState).nextCBlock;
    local_1a0 = (ulong)(uint)zc->bmi2;
    count = zc->entropyWorkspace;
    seq = (zc->seqStore).sequencesStart;
    local_1b0 = (zc->seqStore).sequences;
    source = (zc->seqStore).litStart;
    local_188 = (zc->seqStore).lit;
    local_1d8 = (void *)(srcSize + (long)src);
    local_200 = (zc->seqStore).llCode;
    local_208 = (zc->seqStore).mlCode;
    local_210 = (zc->seqStore).ofCode;
    local_170 = (zc->appliedParams).targetCBlockSize;
    uVar18 = (uint)(entropyMetadata.hufMetadata.hType == set_compressed);
    flags = (uint)(zc->bmi2 != 0);
    local_178 = local_1b0 + -1;
    local_1b8 = &(CTable->entropy).fse;
    local_1c0 = (CTable->entropy).fse.litlengthCTable;
    local_1c8 = (CTable->entropy).fse.matchlengthCTable;
    bVar3 = true;
    local_260 = 0;
    sourceSize = 0;
    local_258 = (byte *)dst;
    local_250 = seq;
    local_220 = src;
    local_1a8 = dst;
    local_198 = zc;
    local_180 = seqStorePtr;
    do {
      uVar17 = sourceSize;
      if (seq == local_1b0) {
LAB_00173567:
        if (local_188 < source) {
          __assert_fail("lp <= lend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4ed3,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
        sourceSize = (long)local_188 - (long)source;
        bVar1 = 1;
        if (sourceSize < uVar17) {
          __assert_fail("litSize <= (size_t)(lend - lp)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4ed4,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
      }
      else {
        psVar14 = local_250 + local_260;
        ZVar7 = ZSTD_getSequenceLength(seqStorePtr,psVar14);
        sourceSize = ((ulong)ZVar7 & 0xffffffff) + sourceSize;
        local_260 = local_260 + 1;
        uVar17 = sourceSize;
        if (psVar14 == local_178) goto LAB_00173567;
        bVar1 = 0;
      }
      local_1f0 = CONCAT44(local_1f0._4_4_,0xff);
      uVar17 = sourceSize;
      if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
        sVar15 = HIST_count_wksp(count,(uint *)&local_1f0,source,sourceSize,count,0x22d8);
        if (sVar15 < 0xffffffffffffff89) {
          sVar8 = HUF_estimateCompressedSize((HUF_CElt *)CTable,count,(uint)local_1f0);
          sVar15 = entropyMetadata.hufMetadata.hufDesSize;
          if (uVar18 == 0) {
            sVar15 = 0;
          }
          uVar17 = sVar8 + sVar15 + 3;
        }
      }
      else if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType != set_rle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4e3d,
                        "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                       );
        }
        uVar17 = 1;
      }
      lVar11 = 3;
      if (local_260 != 0) {
        sVar8 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.ofType,local_210,0x1f,local_260,
                           local_1b8->offcodeCTable,(U8 *)0x0,OF_defaultNorm,5,0x1c,count,
                           CONCAT44(in_stack_fffffffffffffd7c,uVar18));
        sVar9 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.llType,local_200,0x23,local_260,local_1c0,"",
                           LL_defaultNorm,6,0x23,count,CONCAT44(in_stack_fffffffffffffd7c,uVar18));
        sVar10 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.mlType,local_208,0x34,local_260,local_1c8,""
                            ,ML_defaultNorm,6,0x34,count,CONCAT44(in_stack_fffffffffffffd7c,uVar18))
        ;
        sVar15 = 0;
        if (bVar3) {
          sVar15 = entropyMetadata.fseMetadata.fseTablesSize;
        }
        lVar11 = sVar15 + sVar8 + sVar9 + sVar10 + 3;
        seqStorePtr = local_180;
      }
      if (!(bool)(~bVar1 & lVar11 + uVar17 + 3 <= local_170)) {
        local_190 = local_250 + local_260;
        uVar17 = 0;
        lVar23 = 0;
        psVar14 = local_250;
        for (lVar11 = local_260 * 8; 0 < lVar11; lVar11 = lVar11 + -8) {
          ZVar7 = ZSTD_getSequenceLength(seqStorePtr,psVar14);
          uVar17 = uVar17 + ((ulong)ZVar7 & 0xffffffff);
          lVar23 = lVar23 + ((ulong)ZVar7 >> 0x20);
          psVar14 = psVar14 + 1;
        }
        if (sourceSize < uVar17) {
          __assert_fail("litLengthSum <= litSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4d89,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        if (uVar17 != sourceSize && bVar1 == 0) {
          __assert_fail("litLengthSum == litSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4d8b,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        pbVar21 = local_258 + 3;
        sVar15 = (long)dst + (dstCapacity - (long)local_258) + -3;
        lVar11 = 0;
        if (uVar18 != 0) {
          lVar11 = 200;
        }
        sVar22 = set_repeat;
        if (uVar18 != 0) {
          sVar22 = entropyMetadata.hufMetadata.hType;
        }
        lVar11 = (ulong)(0x4000U - lVar11 <= sourceSize) - (ulong)(sourceSize < 0x400U - lVar11);
        in_stack_fffffffffffffd7c = CONCAT13((int)local_1d0 != 0,(int3)in_stack_fffffffffffffd7c);
        if (sourceSize == 0) goto LAB_0017383f;
        if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
          pbVar12 = local_258 + lVar11 + 7;
          if (entropyMetadata.hufMetadata.hType == set_compressed && uVar18 != 0) {
            memcpy(pbVar12,entropyMetadata.hufMetadata.hufDesBuffer,
                   entropyMetadata.hufMetadata.hufDesSize);
            pbVar12 = pbVar12 + entropyMetadata.hufMetadata.hufDesSize;
            sVar8 = entropyMetadata.hufMetadata.hufDesSize;
          }
          else {
            sVar8 = 0;
          }
          uVar17 = lVar11 + 4;
          sVar9 = (long)dst + (dstCapacity - (long)pbVar12);
          if (uVar17 == 3) {
            sVar9 = HUF_compress1X_usingCTable_internal
                              (pbVar12,sVar9,source,sourceSize,(HUF_CElt *)CTable,flags);
          }
          else {
            sVar9 = HUF_compress4X_usingCTable_internal
                              (pbVar12,sVar9,source,sourceSize,(HUF_CElt *)CTable,flags);
          }
          if (0xffffffffffffff87 < sVar9 - 1) goto LAB_00173787;
          uVar20 = sVar8 + sVar9;
          if ((uVar18 == 0) && (sourceSize <= uVar20)) {
LAB_0017383f:
            pbVar12 = (byte *)ZSTD_noCompressLiterals(pbVar21,sVar15,source,sourceSize);
            bVar4 = false;
          }
          else {
            if (uVar17 < ((ulong)(0x3ff < uVar20) - (ulong)(uVar20 < 0x4000)) + 4) {
              if (uVar20 <= sourceSize) {
                __assert_fail("cLitSize > litSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x4d56,
                              "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                             );
              }
              goto LAB_0017383f;
            }
            iVar6 = (int)sourceSize * 0x10;
            uVar19 = (uint)uVar20;
            if (uVar17 == 5) {
              *(symbolEncodingType_e *)(local_258 + 3) = uVar19 * 0x400000 + sVar22 + iVar6 + 0xc;
              local_258[7] = (byte)(uVar19 >> 10);
            }
            else if (uVar17 == 4) {
              *(symbolEncodingType_e *)pbVar21 = uVar19 * 0x40000 + sVar22 + iVar6 + 8;
            }
            else {
              iVar6 = uVar19 * 0x4000 + sVar22 + iVar6;
              *(short *)(local_258 + 3) = (short)iVar6;
              local_258[5] = (byte)((uint)iVar6 >> 0x10);
            }
            pbVar12 = pbVar12 + (sVar9 - (long)pbVar21);
            bVar4 = true;
          }
          if ((byte *)0xffffffffffffff88 < pbVar12) {
            return (size_t)pbVar12;
          }
          if (pbVar12 == (byte *)0x0) goto LAB_00173787;
        }
        else {
          if (entropyMetadata.hufMetadata.hType != set_rle) {
            if (entropyMetadata.hufMetadata.hType != set_basic) {
              __assert_fail("hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4d3d,
                            "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                           );
            }
            goto LAB_0017383f;
          }
          pbVar12 = (byte *)ZSTD_compressRleLiteralsBlock(pbVar21,sVar15,source,sourceSize);
          bVar4 = false;
        }
        pbVar21 = pbVar21 + (long)pbVar12;
        uVar19 = (local_198->appliedParams).cParams.windowLog;
        if ((long)((long)dst + (dstCapacity - (long)pbVar21)) < 4) {
          return (size_t)(byte *)0xffffffffffffffba;
        }
        if (local_260 < 0x7f) {
          *pbVar21 = (byte)local_260;
          if (local_260 != 0) {
            pbVar12 = pbVar21 + 1;
            goto LAB_00173a01;
          }
          bVar2 = true;
          pbVar16 = (byte *)0x1;
LAB_00173b4e:
          pbVar12 = pbVar21 + (long)pbVar16 + -(long)local_258;
          iVar6 = ((byte)((uint)in_stack_fffffffffffffd7c >> 0x18) & bVar1 | 0xffffffec) +
                  (int)pbVar12 * 8;
          *(short *)local_258 = (short)iVar6;
          local_258[2] = (byte)((uint)iVar6 >> 0x10);
          if ((byte *)0xffffffffffffff88 < pbVar12) {
            return (size_t)pbVar12;
          }
          if ((pbVar12 != (byte *)0x0) && (pbVar12 < (byte *)(lVar23 + sourceSize))) {
            local_220 = (void *)((long)local_220 + (long)(lVar23 + sourceSize));
            if (local_1d8 < local_220) {
              __assert_fail("ip + decompressedSize <= iend",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4eef,
                            "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                           );
            }
            source = source + sourceSize;
            local_200 = local_200 + local_260;
            local_208 = local_208 + local_260;
            local_210 = local_210 + local_260;
            if (bVar4) {
              uVar18 = 0;
            }
            if (!bVar2) {
              bVar3 = false;
            }
            local_260 = 0;
            sourceSize = 0;
            local_250 = local_190;
            local_258 = pbVar21 + (long)pbVar16;
          }
        }
        else {
          if (local_260 < 0x7f00) {
            *pbVar21 = (byte)(local_260 >> 8) | 0x80;
            pbVar21[1] = (byte)local_260;
            pbVar12 = pbVar21 + 2;
          }
          else {
            *pbVar21 = 0xff;
            *(short *)(pbVar21 + 1) = (short)local_260 + -0x7f00;
            pbVar12 = pbVar21 + 3;
          }
LAB_00173a01:
          pbVar16 = pbVar12 + 1;
          if (bVar3) {
            *pbVar12 = (char)(entropyMetadata.fseMetadata.ofType << 4) +
                       (char)(entropyMetadata.fseMetadata.llType << 6) +
                       (char)entropyMetadata.fseMetadata.mlType * '\x04';
            memcpy(pbVar16,entropyMetadata.fseMetadata.fseTablesBuffer,
                   entropyMetadata.fseMetadata.fseTablesSize);
            pbVar16 = pbVar16 + entropyMetadata.fseMetadata.fseTablesSize;
          }
          else {
            *pbVar12 = 0xfc;
          }
          pbVar13 = (byte *)ZSTD_encodeSequences
                                      (pbVar16,(long)dst + (dstCapacity - (long)pbVar16),local_1c8,
                                       local_208,local_1b8->offcodeCTable,local_210,local_1c0,
                                       local_200,local_250,local_260,(uint)(0x39 < uVar19),
                                       (int)local_1a0);
          if ((byte *)0xffffffffffffff88 < pbVar13) {
            return (size_t)pbVar13;
          }
          if (((bVar3) && (entropyMetadata.fseMetadata.lastCountSize != 0)) &&
             (pbVar13 + entropyMetadata.fseMetadata.lastCountSize < (byte *)0x4)) {
            if (pbVar13 + entropyMetadata.fseMetadata.lastCountSize != (byte *)0x3) {
              __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4ddf,
                            "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int, int *)"
                           );
            }
          }
          else if (3 < (long)(pbVar16 + ((long)pbVar13 - (long)pbVar12))) {
            pbVar16 = pbVar16 + ((long)pbVar13 - (long)pbVar21);
            if ((byte *)0xffffffffffffff88 < pbVar16) {
              return (size_t)pbVar16;
            }
            if (pbVar16 != (byte *)0x0) {
              bVar2 = false;
              goto LAB_00173b4e;
            }
          }
        }
      }
LAB_00173787:
    } while (bVar1 == 0);
    if (uVar18 != 0) {
      memcpy(CTable,local_1e0,0x810);
    }
    pvVar5 = local_1a8;
    if ((bVar3) &&
       (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
         (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
        (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
      local_258 = (byte *)0x0;
    }
    else {
      if (local_220 < local_1d8) {
        __n = (long)local_1d8 - (long)local_220;
        pbVar21 = (byte *)(__n + 3);
        if ((byte *)((long)dst + (dstCapacity - (long)local_258)) < pbVar21) {
          return (size_t)(byte *)0xffffffffffffffba;
        }
        iVar6 = (int)local_1d0 + (int)__n * 8;
        *(short *)local_258 = (short)iVar6;
        local_258[2] = (byte)((uint)iVar6 >> 0x10);
        memcpy(local_258 + 3,local_220,__n);
        if ((byte *)0xffffffffffffff88 < pbVar21) {
          return (size_t)pbVar21;
        }
        if (pbVar21 == (byte *)0x0) {
          __assert_fail("cSize != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4f12,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
        local_258 = local_258 + (long)pbVar21;
        if (local_250 < local_1b0) {
          local_1e8 = local_1e0->rep[2];
          local_1f0 = *(HUF_CElt *)local_1e0->rep;
          for (; seq < local_250; seq = seq + 1) {
            offBase = seq->offBase;
            ZVar7 = ZSTD_getSequenceLength(seqStorePtr,seq);
            ZSTD_updateRep((U32 *)&local_1f0,offBase,(uint)(ZVar7.litLength == 0));
          }
          CTable->rep[2] = local_1e8;
          *(HUF_CElt *)CTable->rep = local_1f0;
        }
      }
      local_258 = local_258 + -(long)pvVar5;
    }
  }
  return (size_t)local_258;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}